

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::RepeatedEnumFieldGenerator::GenerateByteSize
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *this_00;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"{\n  int data_size = 0;\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "for (int i = 0; i < this->$name$_size(); i++) {\n  data_size += ::google::protobuf::internal::WireFormatLite::EnumSize(\n    this->$name$(i));\n}\n"
                    );
  this_00 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(this_00);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (data_size > 0) {\n  total_size += $tag_size$ +\n    ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);\n}\nGOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_$name$_cached_byte_size_ = data_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\ntotal_size += data_size;\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "total_size += $tag_size$ * this->$name$_size() + data_size;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int data_size = 0;\n");
  printer->Indent();
  printer->Print(variables_,
      "for (int i = 0; i < this->$name$_size(); i++) {\n"
      "  data_size += ::google::protobuf::internal::WireFormatLite::EnumSize(\n"
      "    this->$name$(i));\n"
      "}\n");

  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (data_size > 0) {\n"
      "  total_size += $tag_size$ +\n"
      "    ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);\n"
      "}\n"
      "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "_$name$_cached_byte_size_ = data_size;\n"
      "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "total_size += data_size;\n");
  } else {
    printer->Print(variables_,
      "total_size += $tag_size$ * this->$name$_size() + data_size;\n");
  }
  printer->Outdent();
  printer->Print("}\n");
}